

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestCoverageHandler::IntersectsFilter(cmCTestCoverageHandler *this,LabelSet *labels)

{
  bool bVar1;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> __result;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> ids;
  LabelSet *labels_local;
  cmCTestCoverageHandler *this_local;
  
  ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)labels;
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty(&this->LabelFilter);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_38);
    __first1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    __last1 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    __first2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->LabelFilter);
    __last2 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->LabelFilter);
    __result = std::back_inserter<std::vector<int,std::allocator<int>>>
                         ((vector<int,_std::allocator<int>_> *)local_38);
    std::
    set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
              ((_Rb_tree_const_iterator<int>)__first1._M_node,
               (_Rb_tree_const_iterator<int>)__last1._M_node,
               (_Rb_tree_const_iterator<int>)__first2._M_node,
               (_Rb_tree_const_iterator<int>)__last2._M_node,__result);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)local_38);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestCoverageHandler::IntersectsFilter(LabelSet const& labels)
{
  // If there is no label filter then nothing is filtered out.
  if (this->LabelFilter.empty()) {
    return true;
  }

  std::vector<int> ids;
  std::set_intersection(labels.begin(), labels.end(),
                        this->LabelFilter.begin(), this->LabelFilter.end(),
                        std::back_inserter(ids));
  return !ids.empty();
}